

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffdrivr.c
# Opt level: O3

FT_Error cff_get_glyph_name(CFF_Face face,FT_UInt glyph_index,FT_Pointer buffer,FT_UInt buffer_max)

{
  ushort uVar1;
  void *pvVar2;
  FT_Error FVar3;
  FT_Module module;
  undefined8 *puVar4;
  char *src;
  
  pvVar2 = (face->extra).data;
  if (*(char *)((long)pvVar2 + 0x28) == '\x02') {
    module = FT_Get_Module((((face->root).driver)->root).library,"sfnt");
    puVar4 = (undefined8 *)ft_module_get_service(module,"glyph-dict",'\0');
    FVar3 = 0xb;
    if ((puVar4 != (undefined8 *)0x0) && ((code *)*puVar4 != (code *)0x0)) {
      FVar3 = (*(code *)*puVar4)(face,glyph_index,buffer,buffer_max);
      return FVar3;
    }
  }
  else if (*(long *)((long)pvVar2 + 0x1360) == 0) {
    FVar3 = 0xb;
  }
  else {
    uVar1 = *(ushort *)(*(long *)((long)pvVar2 + 0x520) + (ulong)glyph_index * 2);
    FVar3 = 0;
    if (uVar1 != 0xffff) {
      if (uVar1 < 0x187) {
        src = (char *)(**(code **)(*(long *)((long)pvVar2 + 0x1360) + 0x28))();
      }
      else {
        if (*(uint *)((long)pvVar2 + 0x648) <= uVar1 - 0x187) {
          return 0;
        }
        src = *(char **)(*(long *)((long)pvVar2 + 0x650) + (ulong)(uVar1 - 0x187) * 8);
      }
      FVar3 = 0;
      if (src != (char *)0x0) {
        ft_mem_strcpyn((char *)buffer,src,(ulong)buffer_max);
      }
    }
  }
  return FVar3;
}

Assistant:

static FT_Error
  cff_get_glyph_name( CFF_Face    face,
                      FT_UInt     glyph_index,
                      FT_Pointer  buffer,
                      FT_UInt     buffer_max )
  {
    CFF_Font    font   = (CFF_Font)face->extra.data;
    FT_String*  gname;
    FT_UShort   sid;
    FT_Error    error;


    /* CFF2 table does not have glyph names; */
    /* we need to use `post' table method    */
    if ( font->version_major == 2 )
    {
      FT_Library            library     = FT_FACE_LIBRARY( face );
      FT_Module             sfnt_module = FT_Get_Module( library, "sfnt" );
      FT_Service_GlyphDict  service     =
        (FT_Service_GlyphDict)ft_module_get_service(
                                 sfnt_module,
                                 FT_SERVICE_ID_GLYPH_DICT,
                                 0 );


      if ( service && service->get_name )
        return service->get_name( FT_FACE( face ),
                                  glyph_index,
                                  buffer,
                                  buffer_max );
      else
      {
        FT_ERROR(( "cff_get_glyph_name:"
                   " cannot get glyph name from a CFF2 font\n"
                   "                   "
                   " without the `PSNames' module\n" ));
        error = FT_THROW( Missing_Module );
        goto Exit;
      }
    }

    if ( !font->psnames )
    {
      FT_ERROR(( "cff_get_glyph_name:"
                 " cannot get glyph name from CFF & CEF fonts\n"
                 "                   "
                 " without the `PSNames' module\n" ));
      error = FT_THROW( Missing_Module );
      goto Exit;
    }

    /* first, locate the sid in the charset table */
    sid = font->charset.sids[glyph_index];

    /* now, lookup the name itself */
    gname = cff_index_get_sid_string( font, sid );

    if ( gname )
      FT_STRCPYN( buffer, gname, buffer_max );

    error = FT_Err_Ok;

  Exit:
    return error;
  }